

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O1

void onDataServer(Ptr *ss,Ptr *buff,size_t n)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ClosureTask *this;
  Codecc *this_00;
  TCPSocket *this_01;
  undefined1 auVar3 [8];
  bool bVar4;
  any *paVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  Ptr local_98;
  undefined1 local_88 [8];
  pair<std::shared_ptr<hwnet::Buffer>,_int> ret;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ClosureTask *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  element_type *local_38;
  
  paVar5 = hwnet::TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  this_00 = (Codecc *)paVar5->content[1]._vptr_placeholder;
  psVar1 = &this_00->w;
  *psVar1 = *psVar1 + n;
  ret._16_8_ = ss;
  do {
    bVar4 = hwnet::TCPSocket::IsClosed
                      ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      );
    if (bVar4) {
      return;
    }
    Codecc::Decode((pair<std::shared_ptr<hwnet::Buffer>,_int> *)local_88,this_00);
    auVar3 = local_88;
    if ((int)ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 0) {
      if (local_88 == (undefined1  [8])0x0) {
        iVar7 = 2;
      }
      else {
        if (ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->buff).
                      super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->buff).
                      super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
          }
          if (ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->buff).
                        super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              UNLOCK();
            }
            else {
              p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->buff).
                        super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
            }
          }
        }
        local_38 = ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48 = (ClosureTask *)0x0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var6->_M_use_count = 1;
        p_Var6->_M_weak_count = 1;
        p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001264f8;
        local_58 = (code *)0x0;
        pcStack_50 = (code *)0x0;
        local_68._M_unused._M_object = (void *)0x0;
        local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_68._M_unused._M_object = operator_new(0x18);
        this = (ClosureTask *)(p_Var6 + 1);
        *(undefined1 (*) [8])local_68._M_unused._0_8_ = auVar3;
        *(element_type **)((long)local_68._M_unused._0_8_ + 8) = local_38;
        pcStack_50 = std::
                     _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
                   ::_M_manager;
        hwnet::ClosureTask::ClosureTask(this,(Callback *)&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        local_48 = this;
        _Stack_40._M_pi = p_Var6;
        if ((p_Var6[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
           (*(int *)(p_Var6[2]._vptr__Sp_counted_base + 1) == 0)) {
          *(ClosureTask **)&p_Var6[1]._M_use_count = this;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2),&_Stack_40);
        }
        local_98.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_48->super_Task;
        local_98.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_40._M_pi;
        local_48 = (ClosureTask *)0x0;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        hwnet::ThreadPool::TaskQueue::PostTask(&mainThread.queue_,&local_98);
        if (local_98.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
        }
        ss = (Ptr *)ret._16_8_;
        iVar7 = 0;
        if (local_38 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      }
    }
    else {
      iVar7 = 1;
      hwnet::TCPSocket::Close
                ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    if (ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  } while (iVar7 == 0);
  if (iVar7 == 2) {
    this_01 = (ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Codecc::GetRecvBuffer((Codecc *)&local_68);
    hwnet::TCPSocket::Recv(this_01,(Ptr *)&local_68);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  return;
}

Assistant:

void onDataServer(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	//bytes += n;
	//printf("onData server\n");
	Codecc *code = any_cast<Codecc*>(ss->GetUserData());
	code->onData(n);
	for( ; ; ) {
		if(ss->IsClosed()) return;
		std::pair<Buffer::Ptr,int> ret = code->Decode();
		if(ret.second == 0) {
			if(ret.first != nullptr) {
				auto msg = ret.first;
				mainThread.PostClosure([msg](){
					ccount++;
					std::vector<TCPSocket::Ptr>::iterator it = clients.begin();
					std::vector<TCPSocket::Ptr>::iterator end = clients.end();
					for( ; it != end; it++){
						(*it)->Send(msg);
						count++;
					}
				});
			} else {
				break;
			}
		} else {
			ss->Close();
			return;
		}
	}
	ss->Recv(code->GetRecvBuffer());
}